

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O0

NDeviceChannel * __thiscall NDevice::getChannel(NDevice *this,int index)

{
  size_type sVar1;
  int in_EDX;
  NDeviceChannel *in_RSI;
  NDeviceChannel *in_RDI;
  
  sVar1 = std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>::size
                    ((vector<NDeviceChannel,_std::allocator<NDeviceChannel>_> *)&in_RSI->type);
  if (in_EDX < (int)sVar1) {
    std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>::operator[]
              ((vector<NDeviceChannel,_std::allocator<NDeviceChannel>_> *)&in_RSI->type,(long)in_EDX
              );
    NDeviceChannel::NDeviceChannel(in_RSI,in_RDI);
  }
  else {
    NDeviceChannel::NDeviceChannel(in_RSI);
  }
  return in_RDI;
}

Assistant:

NDeviceChannel NDevice::getChannel(int index) const{
    if (index >= (int)channels.size()) {
        return NDeviceChannel();
    }
    return channels[index];
}